

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSemaphoreUnix.c
# Opt level: O2

deSemaphore deSemaphore_create(int initialValue,deSemaphoreAttributes *attributes)

{
  int iVar1;
  sem_t *__sem;
  
  __sem = (sem_t *)deMalloc(0x20);
  if (__sem != (sem_t *)0x0) {
    iVar1 = sem_init(__sem,0,initialValue);
    if (iVar1 == 0) {
      return (deSemaphore)__sem;
    }
    deFree(__sem);
  }
  return 0;
}

Assistant:

deSemaphore deSemaphore_create (int initialValue, const deSemaphoreAttributes* attributes)
{
	sem_t*	sem	= (sem_t*)deMalloc(sizeof(sem_t));

	DE_UNREF(attributes);
	DE_ASSERT(initialValue >= 0);

	if (!sem)
		return 0;

	if (sem_init(sem, 0, (unsigned int)initialValue) != 0)
	{
		deFree(sem);
		return 0;
	}

	return (deSemaphore)sem;
}